

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackRPMGenerator.cxx
# Opt level: O0

int __thiscall cmCPackRPMGenerator::InitializeInternal(cmCPackRPMGenerator *this)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  allocator<char> local_219;
  string local_218;
  char local_1f2 [2];
  char *local_1f0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  allocator<char> local_1d9;
  string local_1d8;
  cmValue local_1b8;
  undefined1 local_1b0 [8];
  string packageName_1;
  string local_188;
  cmValue local_168;
  allocator<char> local_159;
  string local_158;
  char local_132 [2];
  char *local_130;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  allocator<char> local_119;
  string local_118;
  cmValue local_f8;
  undefined1 local_f0 [8];
  string packageName;
  string local_c8;
  cmValue local_a8;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  string *local_50;
  allocator<char> local_31;
  string local_30;
  cmCPackRPMGenerator *local_10;
  cmCPackRPMGenerator *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"CPACK_PACKAGING_INSTALL_PREFIX",&local_31);
  cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_30,"/usr");
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"CPACK_SET_DESTDIR",&local_71);
  local_50 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_70);
  bVar1 = cmIsOff((cmValue)local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"CPACK_SET_DESTDIR",&local_99);
    cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_98,"I_ON");
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"CPACK_PACKAGE_NAME",
             (allocator<char> *)(packageName.field_2._M_local_buf + 0xf));
  local_a8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_c8);
  bVar1 = cmValue::operator_cast_to_bool(&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)(packageName.field_2._M_local_buf + 0xf));
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"CPACK_PACKAGE_NAME",&local_119);
    local_f8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_118);
    psVar3 = cmValue::operator_cast_to_string_(&local_f8);
    std::__cxx11::string::string((string *)local_f0,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    local_128._M_current = (char *)std::__cxx11::string::begin();
    local_130 = (char *)std::__cxx11::string::end();
    local_132[1] = 0x20;
    local_132[0] = '-';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (local_128,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )local_130,local_132 + 1,local_132);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"CPACK_PACKAGE_NAME",&local_159);
    cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_158,(string *)local_f0);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator(&local_159);
    std::__cxx11::string::~string((string *)local_f0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"CPACK_PACKAGE_FILE_NAME",
             (allocator<char> *)(packageName_1.field_2._M_local_buf + 0xf));
  local_168 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_188);
  bVar1 = cmValue::operator_cast_to_bool(&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator((allocator<char> *)(packageName_1.field_2._M_local_buf + 0xf));
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"CPACK_PACKAGE_FILE_NAME",&local_1d9);
    local_1b8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1d8);
    psVar3 = cmValue::operator_cast_to_string_(&local_1b8);
    std::__cxx11::string::string((string *)local_1b0,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    local_1e8._M_current = (char *)std::__cxx11::string::begin();
    local_1f0 = (char *)std::__cxx11::string::end();
    local_1f2[1] = 0x20;
    local_1f2[0] = '-';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (local_1e8,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )local_1f0,local_1f2 + 1,local_1f2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,"CPACK_PACKAGE_FILE_NAME",&local_219);
    cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_218,(string *)local_1b0);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator(&local_219);
    std::__cxx11::string::~string((string *)local_1b0);
  }
  iVar2 = cmCPackGenerator::InitializeInternal(&this->super_cmCPackGenerator);
  return iVar2;
}

Assistant:

int cmCPackRPMGenerator::InitializeInternal()
{
  this->SetOptionIfNotSet("CPACK_PACKAGING_INSTALL_PREFIX", "/usr");
  if (cmIsOff(this->GetOption("CPACK_SET_DESTDIR"))) {
    this->SetOption("CPACK_SET_DESTDIR", "I_ON");
  }
  /* Replace space in CPACK_PACKAGE_NAME in order to avoid
   * rpmbuild scream on unwanted space in filename issue
   * Moreover RPM file do not usually embed space in filename
   */
  if (this->GetOption("CPACK_PACKAGE_NAME")) {
    std::string packageName = this->GetOption("CPACK_PACKAGE_NAME");
    std::replace(packageName.begin(), packageName.end(), ' ', '-');
    this->SetOption("CPACK_PACKAGE_NAME", packageName);
  }
  /* same for CPACK_PACKAGE_FILE_NAME */
  if (this->GetOption("CPACK_PACKAGE_FILE_NAME")) {
    std::string packageName = this->GetOption("CPACK_PACKAGE_FILE_NAME");
    std::replace(packageName.begin(), packageName.end(), ' ', '-');
    this->SetOption("CPACK_PACKAGE_FILE_NAME", packageName);
  }
  return this->Superclass::InitializeInternal();
}